

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void recfield(LexState *ls,ConsControl *cc)

{
  lu_byte lVar1;
  FuncState *fs_00;
  undefined1 local_70 [8];
  expdesc val;
  expdesc key;
  expdesc tab;
  int reg;
  FuncState *fs;
  ConsControl *cc_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  lVar1 = ls->fs->freereg;
  if ((ls->t).token == 0x123) {
    checklimit(fs_00,cc->nh,0x7fffffff,"items in a constructor");
    codename(ls,(expdesc *)&val.t);
  }
  else {
    yindex(ls,(expdesc *)&val.t);
  }
  cc->nh = cc->nh + 1;
  checknext(ls,0x3d);
  key.t = cc->t->k;
  key.f = *(int *)&cc->t->field_0x4;
  luaK_indexed(fs_00,(expdesc *)&key.t,(expdesc *)&val.t);
  expr(ls,(expdesc *)local_70);
  luaK_storevar(fs_00,(expdesc *)&key.t,(expdesc *)local_70);
  fs_00->freereg = lVar1;
  return;
}

Assistant:

static void recfield (LexState *ls, ConsControl *cc) {
  /* recfield -> (NAME | '['exp']') = exp */
  FuncState *fs = ls->fs;
  int reg = ls->fs->freereg;
  expdesc tab, key, val;
  if (ls->t.token == TK_NAME) {
    checklimit(fs, cc->nh, MAX_INT, "items in a constructor");
    codename(ls, &key);
  }
  else  /* ls->t.token == '[' */
    yindex(ls, &key);
  cc->nh++;
  checknext(ls, '=');
  tab = *cc->t;
  luaK_indexed(fs, &tab, &key);
  expr(ls, &val);
  luaK_storevar(fs, &tab, &val);
  fs->freereg = reg;  /* free registers */
}